

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

CNetAddr * i2p::DestBinToAddr(Binary *dest)

{
  Span<const_unsigned_char> input;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  runtime_error *this;
  size_t in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  CNetAddr *addr;
  string addr_str;
  uchar hash [32];
  CSHA256 hasher;
  CSHA256 *in_stack_fffffffffffffe88;
  CNetAddr *in_stack_fffffffffffffe90;
  uchar *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  CSHA256 *this_00;
  undefined1 in_stack_fffffffffffffed7;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar2;
  byte bVar3;
  string local_f8 [136];
  CSHA256 local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_70;
  CSHA256::CSHA256(in_stack_fffffffffffffe88);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffe88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88);
  CSHA256::Write(this_00,(uchar *)args,(size_t)in_RDI);
  CSHA256::Finalize((CSHA256 *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                    in_stack_fffffffffffffe98);
  uVar2 = 0;
  CNetAddr::CNetAddr(in_stack_fffffffffffffe90);
  Span<const_unsigned_char>::Span<32>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffe88,(uchar (*) [32])0xf69a31);
  input.m_data._7_1_ = uVar2;
  input.m_data._0_7_ = in_stack_fffffffffffffee0;
  input.m_size = in_RSI;
  EncodeBase32_abi_cxx11_(input,(bool)in_stack_fffffffffffffed7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (char *)in_stack_fffffffffffffe98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe88);
  bVar1 = CNetAddr::SetSpecial((CNetAddr *)args,in_RDI);
  if (bVar1) {
    bVar3 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88);
    if ((bVar3 & 1) == 0) {
      CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffffe88);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (CNetAddr *)in_RDI;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>((char *)this_00,args);
    std::runtime_error::runtime_error(this,local_f8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static CNetAddr DestBinToAddr(const Binary& dest)
{
    CSHA256 hasher;
    hasher.Write(dest.data(), dest.size());
    unsigned char hash[CSHA256::OUTPUT_SIZE];
    hasher.Finalize(hash);

    CNetAddr addr;
    const std::string addr_str = EncodeBase32(hash, false) + ".b32.i2p";
    if (!addr.SetSpecial(addr_str)) {
        throw std::runtime_error(strprintf("Cannot parse I2P address: \"%s\"", addr_str));
    }

    return addr;
}